

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void getLpColBounds(HighsLp *lp,HighsInt from_col,HighsInt to_col,double *XcolLower,
                   double *XcolUpper)

{
  const_reference pvVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  HighsInt col;
  undefined4 local_24;
  
  local_24 = in_ESI;
  if (in_ESI <= in_EDX) {
    for (; local_24 < in_EDX + 1; local_24 = local_24 + 1) {
      if (in_RCX != 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            (long)local_24);
        *(value_type *)(in_RCX + (long)(local_24 - in_ESI) * 8) = *pvVar1;
      }
      if (in_R8 != 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),
                            (long)local_24);
        *(value_type *)(in_R8 + (long)(local_24 - in_ESI) * 8) = *pvVar1;
      }
    }
  }
  return;
}

Assistant:

void getLpColBounds(const HighsLp& lp, const HighsInt from_col,
                    const HighsInt to_col, double* XcolLower,
                    double* XcolUpper) {
  assert(0 <= from_col && from_col < lp.num_col_);
  assert(0 <= to_col && to_col < lp.num_col_);
  if (from_col > to_col) return;
  for (HighsInt col = from_col; col < to_col + 1; col++) {
    if (XcolLower != nullptr) XcolLower[col - from_col] = lp.col_lower_[col];
    if (XcolUpper != nullptr) XcolUpper[col - from_col] = lp.col_upper_[col];
  }
}